

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O2

void __thiscall i2p_tests::unlimited_recv::test_method(unlimited_recv *this)

{
  long lVar1;
  DNSLookupFn dns_lookup_function;
  string message;
  string message_00;
  MatchFn match;
  MatchFn match_00;
  bool bVar2;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *pfVar3;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  check_type cVar4;
  _Manager_type in_stack_fffffffffffffb78;
  _Invoker_type in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  _func_int **in_stack_fffffffffffffb98;
  bool in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba1;
  assertion_result local_448;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  bool proxy_error;
  _Any_data local_408;
  code *local_3f8;
  code *local_3f0;
  _Any_data local_3e8;
  code *local_3d8;
  code *local_3d0;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_3c0;
  CService local_3a0;
  Connection conn;
  string local_320 [32];
  DebugLogHelper debugloghelper20;
  string local_2b0 [32];
  DebugLogHelper debugloghelper19;
  path local_240;
  Session session;
  Proxy sam_proxy;
  optional<CService> addr;
  CThreadInterrupt interrupt;
  
  session.m_private_key_file.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)CreateSock.super__Function_base._M_manager;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p =
       (pointer)CreateSock.super__Function_base._M_functor._M_unused._0_8_;
  session.m_private_key_file.super_path._M_pathname._M_string_length =
       CreateSock.super__Function_base._M_functor._8_8_;
  CreateSock.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  CreateSock.super__Function_base._M_functor._8_8_ = 0;
  CreateSock.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:49:18)>
       ::_M_manager;
  session.m_private_key_file.super_path._M_pathname.field_2._8_8_ = CreateSock._M_invoker;
  CreateSock._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:49:18)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&session);
  CThreadInterrupt::CThreadInterrupt(&interrupt);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&session,"127.0.0.1",(allocator<char> *)&conn);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(&local_3c0,&g_dns_lookup_abi_cxx11_);
  pfVar3 = &local_3c0;
  dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffb6c;
  dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffb68;
  dns_lookup_function.super__Function_base._M_functor._8_8_ = (undefined8)_cVar4;
  dns_lookup_function.super__Function_base._M_manager = in_stack_fffffffffffffb78;
  dns_lookup_function._M_invoker = in_stack_fffffffffffffb80;
  Lookup(&addr,(string *)&session,9000,false,dns_lookup_function);
  std::_Function_base::~_Function_base(&local_3c0.super__Function_base);
  std::__cxx11::string::~string((string *)&session);
  if (addr.super__Optional_base<CService,_false,_false>._M_payload.
      super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
      _M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    Proxy::Proxy(&sam_proxy,(CService *)&addr,false);
    ArgsManager::GetDataDirNet((path *)&local_240,&gArgs);
    fs::operator/((path *)&conn,(path *)&local_240,"test_i2p_private_key");
    i2p::sam::Session::Session(&session,(path *)&conn,&sam_proxy,&interrupt);
    std::filesystem::__cxx11::path::~path((path *)&conn);
    std::filesystem::__cxx11::path::~path(&local_240);
    std::__cxx11::string::string<std::allocator<char>>
              (local_2b0,"Creating persistent SAM session",(allocator<char> *)&conn);
    local_3e8._M_unused._M_object = (void *)0x0;
    local_3e8._8_8_ = 0;
    local_3d0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_3d8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb6c;
    message._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb68;
    message._M_string_length = (size_type)_cVar4;
    message.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb78;
    message.field_2._8_8_ = in_stack_fffffffffffffb80;
    match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffb90;
    match.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffb88;
    match.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb98;
    match._M_invoker._0_1_ = in_stack_fffffffffffffba0;
    match._M_invoker._1_7_ = in_stack_fffffffffffffba1;
    DebugLogHelper::DebugLogHelper(&debugloghelper19,message,match);
    std::_Function_base::~_Function_base((_Function_base *)&local_3e8);
    std::__cxx11::string::~string(local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              (local_320,"too many bytes without a terminator",(allocator<char> *)&conn);
    local_408._M_unused._M_object = (void *)0x0;
    local_408._8_8_ = 0;
    local_3f0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_3f8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb6c;
    message_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb68;
    message_00._M_string_length = (size_type)_cVar4;
    message_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb78;
    message_00.field_2._8_8_ = in_stack_fffffffffffffb80;
    match_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffb90;
    match_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffb88
    ;
    match_00.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb98;
    match_00._M_invoker._0_1_ = in_stack_fffffffffffffba0;
    match_00._M_invoker._1_7_ = in_stack_fffffffffffffba1;
    DebugLogHelper::DebugLogHelper(&debugloghelper20,message_00,match_00);
    std::_Function_base::~_Function_base((_Function_base *)&local_408);
    std::__cxx11::string::~string(local_320);
    i2p::Connection::Connection(&conn);
    local_420 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    local_418 = "";
    local_430 = &boost::unit_test::basic_cstring<char_const>::null;
    local_428 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = (iterator)pfVar3;
    file.m_end = (iterator)0x40;
    file.m_begin = (iterator)&local_420;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_430,msg);
    CService::CService(&local_3a0);
    bVar2 = i2p::sam::Session::Connect(&session,&local_3a0,&conn,&proxy_error);
    local_448.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar2;
    local_448.m_message.px = (element_type *)0x0;
    local_448.m_message.pn.pi_ = (sp_counted_base *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_448,(lazy_ostream *)&stack0xfffffffffffffb98,2,0,WARN,_cVar4,
               (size_t)&stack0xfffffffffffffb78,0x40);
    boost::detail::shared_count::~shared_count(&local_448.m_message.pn);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3a0);
    i2p::Connection::~Connection(&conn);
    DebugLogHelper::~DebugLogHelper(&debugloghelper20);
    DebugLogHelper::~DebugLogHelper(&debugloghelper19);
    i2p::sam::Session::~Session(&session);
    Proxy::~Proxy(&sam_proxy);
    std::_Optional_payload_base<CService>::_M_reset((_Optional_payload_base<CService> *)&addr);
    std::condition_variable::~condition_variable(&interrupt.cond);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(unlimited_recv)
{
    CreateSock = [](int, int, int) {
        return std::make_unique<StaticContentsSock>(std::string(i2p::sam::MAX_MSG_SIZE + 1, 'a'));
    };

    CThreadInterrupt interrupt;
    const std::optional<CService> addr{Lookup("127.0.0.1", 9000, false)};
    const Proxy sam_proxy(addr.value(), false);
    i2p::sam::Session session(gArgs.GetDataDirNet() / "test_i2p_private_key", sam_proxy, &interrupt);

    {
        ASSERT_DEBUG_LOG("Creating persistent SAM session");
        ASSERT_DEBUG_LOG("too many bytes without a terminator");

        i2p::Connection conn;
        bool proxy_error;
        BOOST_REQUIRE(!session.Connect(CService{}, conn, proxy_error));
    }
}